

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O1

uint128 CityHashCrc128(char *s,size_t len)

{
  uint64 result [4];
  uint64 auStack_28 [2];
  uint128 local_18;
  
  if (len < 0x385) {
    local_18 = CityHash128(s,len);
  }
  else {
    CityHashCrc256(s,len,auStack_28);
  }
  return local_18;
}

Assistant:

uint128 CityHashCrc128(const char *s, size_t len) {
  if (len <= 900) {
    return CityHash128(s, len);
  } else {
    uint64 result[4];
    CityHashCrc256(s, len, result);
    return uint128(result[2], result[3]);
  }
}